

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantMarkUsedCis(Gia_Man_t *p,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  int iVar1;
  word *pOut;
  word *pInfo;
  int CiId;
  int i;
  void *pData_local;
  _func_int_void_ptr_int *pFuncCiToKeep_local;
  Gia_Man_t *p_local;
  
  pOut = Gia_ManQuantInfoId(p,0);
  Abc_TtClear(pOut,p->nSuppWords);
  iVar1 = Abc_TtIsConst0(pOut,p->nSuppWords);
  if (iVar1 == 0) {
    __assert_fail("Abc_TtIsConst0(pInfo, p->nSuppWords)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                  ,0xac,"void Gia_ManQuantMarkUsedCis(Gia_Man_t *, int (*)(void *, int), void *)");
  }
  for (pInfo._4_4_ = 0; iVar1 = Vec_IntSize(&p->vSuppVars), pInfo._4_4_ < iVar1;
      pInfo._4_4_ = pInfo._4_4_ + 1) {
    iVar1 = Vec_IntEntry(&p->vSuppVars,pInfo._4_4_);
    iVar1 = (*pFuncCiToKeep)(pData,iVar1);
    if (iVar1 == 0) {
      Abc_TtSetBit(pOut,pInfo._4_4_);
    }
  }
  return;
}

Assistant:

void Gia_ManQuantMarkUsedCis( Gia_Man_t * p, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int i, CiId;
    word * pInfo = Gia_ManQuantInfoId( p, 0 );
    Abc_TtClear( pInfo, p->nSuppWords );
    assert( Abc_TtIsConst0(pInfo, p->nSuppWords) );
    Vec_IntForEachEntry( &p->vSuppVars, CiId, i )
        if ( !pFuncCiToKeep( pData, CiId ) ) // quant var
            Abc_TtSetBit( pInfo, i );
}